

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

string * __thiscall
t_cpp_generator::get_legal_program_name
          (string *__return_storage_ptr__,t_cpp_generator *this,string *program_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  ulong uVar4;
  
  uVar4 = std::__cxx11::string::find((char)program_name,0x2e);
  while (uVar4 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)program_name,uVar4,(char *)0x1,0x391c06);
    std::__cxx11::string::_M_assign((string *)program_name);
    uVar4 = std::__cxx11::string::find((char)program_name,0x2e);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (program_name->_M_dataplus)._M_p;
  paVar1 = &program_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&program_name->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = program_name->_M_string_length;
  (program_name->_M_dataplus)._M_p = (pointer)paVar1;
  program_name->_M_string_length = 0;
  (program_name->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

string t_cpp_generator::get_legal_program_name(std::string program_name)
{
  std::size_t found = 0;

  while(true) {
    found = program_name.find('.');

    if(found != string::npos) {
      program_name = program_name.replace(found, 1, "_");
    } else {
      break;
    }
  }

  return program_name;
}